

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

void * __thiscall CClient::SnapFindItem(CClient *this,int SnapID,int Type,int ID)

{
  CSnapshot *this_00;
  int Index;
  CSnapshotItem *pCVar1;
  
  if (this->m_aSnapshots[SnapID] != (CHolder *)0x0) {
    this_00 = this->m_aSnapshots[SnapID]->m_pAltSnap;
    Index = CSnapshot::GetItemIndex(this_00,ID & 0xffffU | Type << 0x10);
    if (Index == -1) {
      pCVar1 = (CSnapshotItem *)0x0;
    }
    else {
      pCVar1 = CSnapshot::GetItem(this_00,Index);
      pCVar1 = pCVar1 + 1;
    }
    return pCVar1;
  }
  return (void *)0x0;
}

Assistant:

const void *CClient::SnapFindItem(int SnapID, int Type, int ID) const
{
	if(!m_aSnapshots[SnapID])
		return 0x0;

	CSnapshot* pAltSnap = m_aSnapshots[SnapID]->m_pAltSnap;
	int Key = (Type<<16)|(ID&0xffff);
	int Index = pAltSnap->GetItemIndex(Key);
	if(Index != -1)
		return pAltSnap->GetItem(Index)->Data();

	return 0x0;
}